

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

void FIX::double_conversion::TrimAndCut
               (Vector<const_char> buffer,int exponent,char *buffer_copy_space,int space_size,
               Vector<const_char> *trimmed,int *updated_exponent)

{
  char *pcVar1;
  undefined1 auVar2 [12];
  long lVar3;
  char *in_RAX;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 in_register_00000084;
  undefined8 *puVar10;
  char *pcVar11;
  bool bVar12;
  Vector<const_char> VVar13;
  Vector<const_char> local_40;
  
  puVar10 = (undefined8 *)CONCAT44(in_register_00000084,space_size);
  local_40.start_ = buffer.start_;
  local_40.length_ = buffer.length_;
  bVar12 = 0 < local_40.length_;
  if (local_40.length_ < 1) {
    uVar6 = 0;
  }
  else {
    in_RAX = (char *)(ulong)(uint)local_40.length_;
    if (*local_40.start_ == '0') {
      uVar6 = 0;
      pcVar11 = (char *)0x0;
      do {
        if (in_RAX + -1 == pcVar11) {
          bVar12 = false;
          goto LAB_00168c0a;
        }
        pcVar4 = pcVar11 + 1;
        pcVar1 = local_40.start_ + 1 + (long)pcVar11;
        pcVar11 = pcVar4;
      } while (*pcVar1 == '0');
      bVar12 = pcVar4 < in_RAX;
    }
    else {
      bVar12 = true;
      pcVar4 = (char *)0x0;
    }
    VVar13 = Vector<const_char>::SubVector(&local_40,(int)pcVar4,local_40.length_);
    uVar6 = VVar13.length_;
    in_RAX = VVar13.start_;
  }
LAB_00168c0a:
  if (!bVar12) {
    in_RAX = local_40.start_;
  }
  uVar9 = (ulong)uVar6;
  iVar7 = uVar6 + 1;
  do {
    iVar5 = (int)uVar9;
    local_40.start_ = in_RAX;
    local_40.length_ = uVar6;
    if (iVar5 < 1) {
      auVar2._8_4_ = 0;
      auVar2._0_8_ = in_RAX;
      goto LAB_00168c49;
    }
    iVar7 = iVar7 + -1;
    lVar3 = uVar9 - 1;
    uVar9 = uVar9 - 1;
  } while (in_RAX[lVar3] == '0');
  VVar13 = Vector<const_char>::SubVector(&local_40,0,iVar7);
  auVar2 = VVar13._0_12_;
LAB_00168c49:
  pcVar4 = auVar2._0_8_;
  if (iVar5 < 1) {
    pcVar4 = local_40.start_;
  }
  uVar8 = auVar2._8_4_;
  iVar7 = (uVar6 - uVar8) + exponent;
  if ((int)uVar8 < 0x30d) {
    *puVar10 = pcVar4;
    *(uint *)(puVar10 + 1) = uVar8;
    *(int *)&trimmed->start_ = iVar7;
  }
  else {
    uVar9 = 0;
    do {
      if (uVar8 == uVar9) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]"
                     );
      }
      buffer_copy_space[uVar9] = pcVar4[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x30b);
    if (pcVar4[(ulong)uVar8 - 1] == '0') {
      __assert_fail("buffer[buffer.length() - 1] != \'0\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0x78,
                    "void FIX::double_conversion::CutToMaxSignificantDigits(Vector<const char>, int, char *, int *)"
                   );
    }
    buffer_copy_space[0x30b] = '1';
    *(uint *)&trimmed->start_ = uVar8 + iVar7 + -0x30c;
    if (buffer_copy_space == (char *)0x0) {
      __assert_fail("len == 0 || (len > 0 && data != __null)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xb3,
                    "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]")
      ;
    }
    *puVar10 = buffer_copy_space;
    *(undefined4 *)(puVar10 + 1) = 0x30c;
  }
  return;
}

Assistant:

static void TrimAndCut(Vector<const char> buffer, int exponent,
                       char* buffer_copy_space, int space_size,
                       Vector<const char>* trimmed, int* updated_exponent) {
  Vector<const char> left_trimmed = TrimLeadingZeros(buffer);
  Vector<const char> right_trimmed = TrimTrailingZeros(left_trimmed);
  exponent += left_trimmed.length() - right_trimmed.length();
  if (right_trimmed.length() > kMaxSignificantDecimalDigits) {
    (void) space_size;  // Mark variable as used.
    ASSERT(space_size >= kMaxSignificantDecimalDigits);
    CutToMaxSignificantDigits(right_trimmed, exponent,
                              buffer_copy_space, updated_exponent);
    *trimmed = Vector<const char>(buffer_copy_space,
                                 kMaxSignificantDecimalDigits);
  } else {
    *trimmed = right_trimmed;
    *updated_exponent = exponent;
  }
}